

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseBoundValueTypeList
          (WastParser *this,TokenType token,TypeVector *types,BindingHash *bindings,
          ReferenceVars *type_vars,Index binding_index_offset)

{
  bool bVar1;
  Result RVar2;
  size_type sVar3;
  char *pcVar4;
  int __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  Type local_1a8;
  Var local_1a0;
  ReferenceVar local_158;
  Type local_108;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_true>
  local_100;
  Binding local_f8;
  int local_d0;
  Enum local_cc;
  undefined1 local_c8 [8];
  Location loc;
  Var type;
  string name;
  Index binding_index_offset_local;
  ReferenceVars *type_vars_local;
  BindingHash *bindings_local;
  TypeVector *types_local;
  TokenType token_local;
  WastParser *this_local;
  
  do {
    bVar1 = MatchLpar(this,token);
    if (!bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    bVar1 = PeekMatch(this,Last_String,0);
    if (bVar1) {
      std::__cxx11::string::string((string *)((long)&type.field_2 + 0x18));
      Var::Var((Var *)((long)&loc.field_1 + 8));
      GetLocation((Location *)local_c8,this);
      ParseBindVarOpt(this,(string *)((long)&type.field_2 + 0x18));
      local_cc = (Enum)ParseValueType(this,(Var *)((long)&loc.field_1 + 8));
      bVar1 = Failed((Result)local_cc);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_d0 = 1;
      }
      else {
        sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(types);
        Binding::Binding(&local_f8,(Location *)local_c8,binding_index_offset + (int)sVar3);
        __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&type.field_2 + 0x18);
        local_100._M_cur =
             (__node_type *)
             std::
             unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
             ::emplace<std::__cxx11::string&,wabt::Binding>
                       ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                         *)bindings,__args,&local_f8);
        bVar1 = Var::is_index((Var *)((long)&loc.field_1 + 8));
        if (bVar1) {
          pcVar4 = Var::index((Var *)((long)&loc.field_1 + 8),(char *)__args,__c);
          Type::Type(&local_108,(int32_t)pcVar4);
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back(types,&local_108);
        }
        else {
          bVar1 = Var::is_name((Var *)((long)&loc.field_1 + 8));
          if (!bVar1) {
            __assert_fail("type.is_name()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                          ,0x80e,
                          "Result wabt::WastParser::ParseBoundValueTypeList(TokenType, TypeVector *, BindingHash *, ReferenceVars *, Index)"
                         );
          }
          bVar1 = Features::function_references_enabled(&this->options_->features);
          if (!bVar1) {
            __assert_fail("options_->features.function_references_enabled()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                          ,0x80f,
                          "Result wabt::WastParser::ParseBoundValueTypeList(TokenType, TypeVector *, BindingHash *, ReferenceVars *, Index)"
                         );
          }
          sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(types);
          Var::Var(&local_1a0,(Var *)((long)&loc.field_1 + 8));
          ReferenceVar::ReferenceVar(&local_158,(uint32_t)sVar3,&local_1a0);
          std::
          vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>::
          push_back(type_vars,&local_158);
          ReferenceVar::~ReferenceVar(&local_158);
          Var::~Var(&local_1a0);
          Type::Type(&local_1a8,Reference,0xffffffff);
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back(types,&local_1a8);
        }
        local_d0 = 0;
      }
      Var::~Var((Var *)((long)&loc.field_1 + 8));
      std::__cxx11::string::~string((string *)((long)&type.field_2 + 0x18));
      if (local_d0 != 0) {
        return (Result)this_local._4_4_;
      }
    }
    else {
      RVar2 = ParseValueTypeList(this,types,type_vars);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    RVar2 = Expect(this,Rpar);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseBoundValueTypeList(TokenType token,
                                           TypeVector* types,
                                           BindingHash* bindings,
                                           ReferenceVars* type_vars,
                                           Index binding_index_offset) {
  WABT_TRACE(ParseBoundValueTypeList);
  while (MatchLpar(token)) {
    if (PeekMatch(TokenType::Var)) {
      std::string name;
      Var type;
      Location loc = GetLocation();
      ParseBindVarOpt(&name);
      CHECK_RESULT(ParseValueType(&type));
      bindings->emplace(name,
                        Binding(loc, binding_index_offset + types->size()));
      if (type.is_index()) {
        types->push_back(Type(type.index()));
      } else {
        assert(type.is_name());
        assert(options_->features.function_references_enabled());
        type_vars->push_back(ReferenceVar(types->size(), type));
        types->push_back(Type(Type::Reference, kInvalidIndex));
      }
    } else {
      CHECK_RESULT(ParseValueTypeList(types, type_vars));
    }
    EXPECT(Rpar);
  }
  return Result::Ok;
}